

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall brown::Tile::drawcircfill(Tile *this,int xc,int yc,int r,uint32_t col)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  double dVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar6 = yc - r;
  auVar14 = _DAT_001071c0;
  auVar15 = _DAT_001071d0;
  auVar16 = _DAT_001071e0;
  if ((int)uVar6 <= r + yc) {
    do {
      dVar8 = (double)(int)(((yc - uVar6) + r) * (r - (yc - uVar6)));
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
        auVar14 = _DAT_001071c0;
        auVar15 = _DAT_001071d0;
        auVar16 = _DAT_001071e0;
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (uVar6 < (uint)this->y) {
        uVar2 = xc - (int)dVar8;
        uVar1 = (int)dVar8 + xc;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if (this->x < (int)uVar1) {
          uVar1 = this->x;
        }
        if ((int)uVar2 < (int)uVar1) {
          lVar3 = (ulong)uVar1 - (ulong)uVar2;
          lVar4 = lVar3 + -1;
          auVar9._8_4_ = (int)lVar4;
          auVar9._0_8_ = lVar4;
          auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
          lVar4 = (long)(int)uVar6 * (long)this->p + this->f + (ulong)uVar2 * 4;
          auVar9 = auVar9 ^ auVar16;
          uVar5 = 0;
          do {
            auVar11._8_4_ = (int)uVar5;
            auVar11._0_8_ = uVar5;
            auVar11._12_4_ = (int)(uVar5 >> 0x20);
            auVar12 = (auVar11 | auVar15) ^ auVar16;
            iVar10 = auVar9._4_4_;
            if ((bool)(~(iVar10 < auVar12._4_4_ ||
                        auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == iVar10) & 1)) {
              *(uint32_t *)(lVar4 + uVar5 * 4) = col;
            }
            if (auVar12._12_4_ <= auVar9._12_4_ &&
                (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
              *(uint32_t *)(lVar4 + 4 + uVar5 * 4) = col;
            }
            auVar11 = (auVar11 | auVar14) ^ auVar16;
            iVar13 = auVar11._4_4_;
            if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
              *(uint32_t *)(lVar4 + 8 + uVar5 * 4) = col;
              *(uint32_t *)(lVar4 + 0xc + uVar5 * 4) = col;
            }
            uVar5 = uVar5 + 4;
          } while ((lVar3 + 3U & 0xfffffffffffffffc) != uVar5);
        }
      }
      bVar7 = uVar6 != r + yc;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  return;
}

Assistant:

void Tile::drawcircfill (int xc, int yc, int r, std::uint32_t col)
{
    int i, y;
    for(y=yc-r;y<=yc+r;y++)
    {
        i = (int)sqrt((double)(r*r - (yc-y)*(yc-y)));
        this->drawhlin(xc-i,xc+i,y,col);
    }
}